

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

string * __thiscall
flow::RegExpGroupInstr::to_string_abi_cxx11_(string *__return_storage_ptr__,RegExpGroupInstr *this)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"reggroup",&local_39);
  Instr::formatOne(__return_storage_ptr__,&this->super_Instr,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string RegExpGroupInstr::to_string() const {
  return formatOne("reggroup");
}